

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

void __thiscall stackjit::ArrayType::ArrayType(ArrayType *this,Type *elementType)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"Array[",&elementType->mName);
  std::operator+(&bStack_58,&local_38,"]");
  ReferenceType::ReferenceType(&this->super_ReferenceType,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_ReferenceType).super_Type._vptr_Type = (_func_int **)&PTR__ArrayType_0019bc78;
  this->mElementType = elementType;
  return;
}

Assistant:

ArrayType::ArrayType(const Type* elementType)
		: ReferenceType("Array[" + elementType->name() + "]"), mElementType(elementType) {

	}